

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_quass.cpp
# Opt level: O2

QpAsmStatus
solveqp(Instance *instance,Settings *settings,Statistics *stats,HighsModelStatus *highs_model_status
       ,HighsBasis *highs_basis,HighsSolution *highs_solution,HighsTimer *qp_timer)

{
  long lVar1;
  vector<double,_std::allocator<double>_> *__x;
  HighsBasisStatus HVar2;
  uint num_var;
  pointer piVar3;
  pointer pdVar4;
  int iVar5;
  HighsStatus HVar6;
  QpAsmStatus QVar7;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *num_var_infeasibilities;
  pointer piVar8;
  ulong uVar9;
  long lVar10;
  void *__buf;
  char cVar11;
  ulong uVar12;
  int d;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  pointer pdVar17;
  ulong uVar18;
  long lVar19;
  HighsInt i_4;
  long lVar20;
  HighsInt i;
  bool bVar21;
  double extraout_XMM0_Qa;
  double dVar22;
  double dVar23;
  double dVar24;
  HighsSolution *highs_solution_00;
  BasisStatus local_5cc8;
  QpModelStatus qp_model_status;
  vector<double,_std::allocator<double>_> *local_5cc0;
  vector<BasisStatus,_std::allocator<BasisStatus>_> atlower;
  vector<BasisStatus,_std::allocator<BasisStatus>_> initial_status;
  vector<int,_std::allocator<int>_> debug_col_status_count;
  vector<int,_std::allocator<int>_> initialinactive;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_5c08;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_5bf0;
  vector<double,_std::allocator<double>_> L;
  vector<int,_std::allocator<int>_> debug_row_status_count;
  vector<int,_std::allocator<int>_> initialactive;
  pointer local_5b18;
  int local_5b10;
  pointer local_5b00;
  int local_5af8;
  QpHotstartInformation startinfo;
  QpVector x0;
  vector<double,_std::allocator<double>_> local_59f8;
  vector<double,_std::allocator<double>_> local_59e0;
  vector<double,_std::allocator<double>_> local_59c8;
  MatrixFormat local_59b0;
  vector<int,_std::allocator<int>_> local_59a0 [2];
  vector<int,_std::allocator<int>_> local_5970;
  vector<double,_std::allocator<double>_> local_5958 [29];
  QpSolution qp_solution;
  QpVector ra;
  QpVector res;
  HighsBasis local_5180 [38];
  HighsInt local_4330;
  HighsModelStatus local_3fac;
  
  qp_model_status = kUndetermined;
  QpSolution::QpSolution(&qp_solution,instance);
  num_var = instance->num_var;
  piVar8 = (instance->Q).mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = 0;
  uVar18 = 0;
  if (0 < (int)num_var) {
    uVar9 = (ulong)num_var;
  }
  while (uVar12 = uVar18, uVar12 != uVar9) {
    iVar5 = piVar8[uVar12 + 1];
    piVar3 = (instance->Q).mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar17 = (instance->Q).mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar15 = (long)piVar8[uVar12]; uVar18 = uVar12 + 1, lVar15 < iVar5; lVar15 = lVar15 + 1) {
      if (uVar12 == (uint)piVar3[lVar15]) {
        pdVar17[lVar15] = settings->hessianregularizationfactor + pdVar17[lVar15];
      }
    }
  }
  QpHotstartInformation::QpHotstartInformation(&startinfo,num_var,instance->num_con);
  bVar21 = instance->num_con == 0;
  iVar5 = instance->num_var;
  num_var_infeasibilities =
       (vector<BasisStatus,_std::allocator<BasisStatus>_> *)
       CONCAT71((int7)(uVar12 >> 8),iVar5 < 0x3a99 && bVar21);
  if (iVar5 < 0x3a99 && bVar21) {
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::resize(&L,(ulong)(uint)(iVar5 * iVar5));
    uVar9 = (ulong)(uint)instance->num_var;
    lVar15 = 0;
    uVar18 = 0;
    while (uVar18 < (ulong)(long)(int)uVar9) {
      piVar8 = (instance->Q).mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar12 = (ulong)piVar8[uVar18]; uVar12 < (ulong)(long)piVar8[uVar18 + 1];
          uVar12 = uVar12 + 1) {
        uVar14 = (ulong)(instance->Q).mat.index.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar12];
        uVar9 = (ulong)(uint)instance->num_var;
        lVar10 = (long)instance->num_var;
        if (uVar18 == uVar14) {
          pdVar13 = (double *)
                    ((long)L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar15);
          dVar22 = 0.0;
          uVar9 = uVar18;
          while (bVar21 = uVar9 != 0, uVar9 = uVar9 - 1, bVar21) {
            dVar22 = dVar22 + *pdVar13 * *pdVar13;
            pdVar13 = pdVar13 + lVar10;
          }
          dVar22 = (instance->Q).mat.value.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar12] - dVar22;
          if (dVar22 < 0.0) {
            dVar22 = sqrt(dVar22);
          }
          else {
            dVar22 = SQRT(dVar22);
          }
          uVar9 = (ulong)instance->num_var;
          L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[(uVar9 + 1) * uVar18] = dVar22;
          piVar8 = (instance->Q).mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          dVar22 = 0.0;
          uVar16 = uVar14;
          pdVar17 = L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          while (bVar21 = uVar16 != 0, uVar16 = uVar16 - 1, bVar21) {
            dVar22 = dVar22 + *(double *)((long)pdVar17 + lVar15) * pdVar17[uVar14];
            pdVar17 = pdVar17 + lVar10;
          }
          L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar10 * uVar14 + uVar18] =
               ((instance->Q).mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12] - dVar22) /
               L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[(lVar10 + 1) * uVar14];
        }
      }
      lVar15 = lVar15 + 8;
      uVar18 = uVar18 + 1;
    }
    QpVector::operator-(&res,&instance->c);
    lVar15 = (long)res.dim;
    d = instance->num_var;
    iVar5 = d + 1;
    lVar10 = 0;
    uVar18 = 0;
    if (0 < res.dim) {
      uVar18 = (ulong)(uint)res.dim;
    }
    for (uVar9 = 0; uVar9 != uVar18; uVar9 = uVar9 + 1) {
      pdVar13 = (double *)
                ((long)L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar10);
      for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] =
             res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] -
             res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12] * *pdVar13;
        pdVar13 = pdVar13 + d;
      }
      res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9] =
           res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar9] /
           L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar5 * (int)uVar9];
      d = instance->num_var;
      lVar10 = lVar10 + 8;
    }
    lVar10 = lVar15 * 8;
    lVar19 = lVar15;
    while (lVar10 = lVar10 + -8, 0 < lVar19) {
      lVar1 = lVar19 + -1;
      dVar22 = 0.0;
      for (lVar20 = lVar15; lVar19 < lVar20; lVar20 = lVar20 + -1) {
        dVar22 = dVar22 + res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar20 + -1] *
                          *(double *)
                           ((long)L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start +
                           lVar20 * 8 + instance->num_var * lVar10 + -8);
      }
      res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar1] =
           (res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar1] - dVar22) /
           L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[(d + 1) * (int)lVar1];
      lVar19 = lVar1;
    }
    QpVector::QpVector(&x0,d);
    QpVector::QpVector(&ra,instance->num_con);
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (lVar15 = 0; lVar15 < instance->num_var; lVar15 = lVar15 + 1) {
      dVar22 = res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15];
      dVar23 = 0.5 / settings->hessianregularizationfactor;
      if ((((dVar23 < dVar22) &&
           (INFINITY <=
            (instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15])) &&
          (pdVar13 = (instance->c).value.super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start + lVar15, *pdVar13 <= 0.0 && *pdVar13 != 0.0)
          ) || (((dVar24 = (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar15], dVar22 < dVar23 &&
                 (INFINITY <= dVar24)) &&
                (dVar24 = INFINITY,
                0.0 < (instance->c).value.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar15])))) {
        qp_model_status = kUnbounded;
        goto LAB_00322133;
      }
      iVar5 = (int)lVar15;
      if (dVar22 <= dVar24) {
        res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar15] = dVar24;
        initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(initial_status.
                               super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,instance->num_con + iVar5);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&initialactive,(int *)&initial_status);
        initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(initial_status.
                               super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,1);
        std::vector<BasisStatus,_std::allocator<BasisStatus>_>::emplace_back<BasisStatus>
                  (&atlower,(BasisStatus *)&initial_status);
      }
      else {
        dVar23 = (instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15];
        if (dVar23 <= dVar22) {
          res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar15] = dVar23;
          initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(initial_status.
                                 super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 instance->num_con + iVar5);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (&initialactive,(int *)&initial_status);
          initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(initial_status.
                                 super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,2);
          std::vector<BasisStatus,_std::allocator<BasisStatus>_>::emplace_back<BasisStatus>
                    (&atlower,(BasisStatus *)&initial_status);
        }
        else {
          initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(initial_status.
                                 super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 instance->num_con + iVar5);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (&initialinactive,(int *)&initial_status);
        }
      }
      if (0.0001 < ABS(res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar15])) {
        x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar15] =
             res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar15];
        lVar10 = (long)x0.num_nz;
        x0.num_nz = x0.num_nz + 1;
        x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10] = iVar5;
      }
    }
    if (initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      qp_model_status = kOptimal;
    }
    std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=(&startinfo.status,&atlower);
    std::vector<int,_std::allocator<int>_>::operator=(&startinfo.active,&initialactive);
    std::vector<int,_std::allocator<int>_>::operator=(&startinfo.inactive,&initialinactive);
    QpVector::operator=(&startinfo.primal,&x0);
    QpVector::operator=(&startinfo.rowact,&ra);
LAB_00322133:
    std::_Vector_base<BasisStatus,_std::allocator<BasisStatus>_>::~_Vector_base
              (&atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&initialinactive.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&initialactive.super__Vector_base<int,_std::allocator<int>_>);
    QpVector::~QpVector(&ra);
    QpVector::~QpVector(&x0);
    QpVector::~QpVector(&res);
    highs_solution_00 = (HighsSolution *)0x32218b;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&L.super__Vector_base<double,_std::allocator<double>_>);
    if (qp_model_status == kUnbounded) goto LAB_00322455;
    if (qp_model_status == kOptimal) {
      highs_solution_00 = (HighsSolution *)0x3221b6;
      QpVector::operator=(&qp_solution.primal,&startinfo.primal);
      goto LAB_00322455;
    }
  }
  else {
    if (highs_solution->value_valid == true) {
      num_var_infeasibilities = &atlower;
      atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                            _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      res.num_nz = 0;
      res.dim = 0;
      x0.num_nz = 0;
      x0.dim = 0;
      initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)initial_status.
                            super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
      ra.num_nz = 0;
      ra.dim = 0;
      L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      assessQpPrimalFeasibility
                (instance,settings->lambda_zero_threshold,&highs_solution->col_value,
                 &highs_solution->row_value,(HighsInt *)num_var_infeasibilities,(double *)&res,
                 (double *)&x0,(HighsInt *)&initial_status,(double *)&ra,(double *)&L,
                 (double *)&initialactive,(double *)&initialinactive);
      if ((int)initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start != 0 ||
          (int)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start != 0) goto LAB_0032191b;
      cVar11 = highs_basis->valid;
    }
    else {
LAB_0032191b:
      cVar11 = '\0';
    }
    HighsBasis::HighsBasis((HighsBasis *)&initialactive);
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffff0000);
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (cVar11 == '\0') {
      Highs::Highs((Highs *)&res);
      std::__cxx11::string::string((string *)&x0,"output_flag",(allocator *)&ra);
      Highs::setOptionValue((Highs *)&res,(string *)&x0,false);
      std::__cxx11::string::~string((string *)&x0);
      std::__cxx11::string::string((string *)&x0,"presolve",(allocator *)&ra);
      Highs::setOptionValue((Highs *)&res,(string *)&x0,&kHighsOnString_abi_cxx11_);
      std::__cxx11::string::~string((string *)&x0);
      local_5cc0 = (vector<double,_std::allocator<double>_> *)settings->time_limit;
      HighsTimer::read(qp_timer,0,__buf,(size_t)num_var_infeasibilities);
      std::__cxx11::string::string((string *)&x0,"time_limit",(allocator *)&ra);
      dVar22 = 0.001;
      if (0.001 <= (double)local_5cc0 - extraout_XMM0_Qa) {
        dVar22 = (double)local_5cc0 - extraout_XMM0_Qa;
      }
      Highs::setOptionValue((Highs *)&res,(string *)&x0,dVar22);
      std::__cxx11::string::~string((string *)&x0);
      HighsLp::HighsLp((HighsLp *)&x0);
      std::vector<int,_std::allocator<int>_>::operator=(&local_5970,&(instance->A).mat.index);
      std::vector<int,_std::allocator<int>_>::operator=(local_59a0,&(instance->A).mat.start);
      std::vector<double,_std::allocator<double>_>::operator=(local_5958,&(instance->A).mat.value);
      local_59b0 = kColwise;
      ra.num_nz = 0;
      ra.dim = 0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)&x0.index,(long)instance->num_var,
                 (value_type_conflict1 *)&ra);
      __x = &instance->var_lo;
      std::vector<double,_std::allocator<double>_>::operator=(&x0.value,__x);
      local_5cc0 = &instance->var_up;
      std::vector<double,_std::allocator<double>_>::operator=(&local_59f8,local_5cc0);
      std::vector<double,_std::allocator<double>_>::operator=(&local_59e0,&instance->con_lo);
      std::vector<double,_std::allocator<double>_>::operator=(&local_59c8,&instance->con_up);
      x0.num_nz = instance->num_var;
      x0.dim = instance->num_con;
      if (settings->phase1boundfreevars == true) {
        pdVar17 = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar4 = (local_5cc0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = 0;
        uVar18 = x0._0_8_ & 0xffffffff;
        if (x0.num_nz < 1) {
          uVar18 = uVar9;
        }
        for (; uVar18 != uVar9; uVar9 = uVar9 + 1) {
          if ((pdVar17[uVar9] <= -INFINITY) && (INFINITY <= pdVar4[uVar9])) {
            x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] = -100000.0;
            local_59f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] = 100000.0;
          }
        }
      }
      HighsLp::HighsLp((HighsLp *)&ra,(HighsLp *)&x0);
      Highs::passModel((Highs *)&res,(HighsLp *)&ra);
      HighsLp::~HighsLp((HighsLp *)&ra);
      if (settings->phase1movefreevarsbasic == true) {
        HighsBasis::HighsBasis((HighsBasis *)&initialinactive);
        initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start._0_2_ =
             CONCAT11(1,initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._0_1_);
        for (iVar5 = 0; iVar5 < instance->num_con; iVar5 = iVar5 + 1) {
          atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT71(atlower.
                                 super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,4);
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
          emplace_back<HighsBasisStatus>(&local_5bf0,(HighsBasisStatus *)&atlower);
        }
        for (lVar15 = 0; lVar15 < instance->num_var; lVar15 = lVar15 + 1) {
          if ((-INFINITY <
               (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar15]) ||
             ((local_5cc0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar15] < INFINITY)) {
            atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(atlower.
                                   super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                   _M_impl.super__Vector_impl_data._M_start._1_7_,4);
            std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
            emplace_back<HighsBasisStatus>(&local_5c08,(HighsBasisStatus *)&atlower);
          }
          else {
            atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(atlower.
                                   super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                   _M_impl.super__Vector_impl_data._M_start._1_7_,1);
            std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
            emplace_back<HighsBasisStatus>(&local_5c08,(HighsBasisStatus *)&atlower);
          }
        }
        std::__cxx11::string::string((string *)&atlower,"",(allocator *)&initial_status);
        Highs::setBasis((Highs *)&res,(HighsBasis *)&initialinactive,(string *)&atlower);
        std::__cxx11::string::~string((string *)&atlower);
        std::__cxx11::string::string
                  ((string *)&atlower,"simplex_strategy",(allocator *)&initial_status);
        Highs::setOptionValue((Highs *)&res,(string *)&atlower,4);
        std::__cxx11::string::~string((string *)&atlower);
        HighsBasis::~HighsBasis((HighsBasis *)&initialinactive);
      }
      HVar6 = Highs::run((Highs *)&res);
      if (HVar6 == kError) {
        qp_model_status = kError;
        HighsLp::~HighsLp((HighsLp *)&x0);
      }
      else {
        if (local_3fac == kOptimal) {
          qp_model_status = kNotset;
          stats->phase1_iterations = local_4330;
          HighsBasis::operator=((HighsBasis *)&initialactive,local_5180);
          HighsSolution::operator=((HighsSolution *)&L,(HighsSolution *)&res.index);
          HighsLp::~HighsLp((HighsLp *)&x0);
          Highs::~Highs((Highs *)&res);
          local_5cc0 = (vector<double,_std::allocator<double>_> *)0x3f1a36e2eb1c432d;
          goto LAB_003219a0;
        }
        if (local_3fac == kInfeasible) {
          qp_model_status = kInfeasible;
        }
        else if (local_3fac == kTimeLimit) {
          qp_model_status = kTimeLimit;
        }
        else if (local_3fac == kInterrupt) {
          qp_model_status = kInterrupt;
        }
        else {
          qp_model_status = kError;
        }
        stats->phase1_iterations = local_4330;
        HighsLp::~HighsLp((HighsLp *)&x0);
      }
      Highs::~Highs((Highs *)&res);
    }
    else {
      HighsBasis::operator=((HighsBasis *)&initialactive,highs_basis);
      HighsSolution::operator=((HighsSolution *)&L,highs_solution);
      qp_model_status = kNotset;
      local_5cc0 = (vector<double,_std::allocator<double>_> *)0x0;
LAB_003219a0:
      QpVector::QpVector(&res,instance->num_var);
      QpVector::QpVector(&x0,instance->num_con);
      for (lVar15 = 0; lVar15 < res.dim; lVar15 = lVar15 + 1) {
        if ((double)local_5cc0 <
            ABS(L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish[lVar15])) {
          res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar15] =
               L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_finish[lVar15];
          lVar10 = (long)res.num_nz;
          res.num_nz = res.num_nz + 1;
          res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar10] = (int)lVar15;
        }
      }
      for (lVar15 = 0; lVar15 < x0.dim; lVar15 = lVar15 + 1) {
        if ((double)local_5cc0 < ABS(*(double *)(lVar15 * 8))) {
          x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar15] = *(double *)(lVar15 * 8);
          lVar10 = (long)x0.num_nz;
          x0.num_nz = x0.num_nz + 1;
          x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar10] = (int)lVar15;
        }
      }
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (&debug_row_status_count,5,(value_type_conflict2 *)&debug_col_status_count);
      iVar5 = 0;
      while( true ) {
        debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,iVar5);
        if (local_5af8 - (int)local_5b00 <= iVar5) break;
        HVar2 = local_5b00[iVar5];
        debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[HVar2] =
             debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[HVar2] + 1;
        if (HVar2 == kUpper) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&initialinactive,(value_type_conflict2 *)&debug_col_status_count);
          local_5cc8 = kActiveAtUpper;
          std::vector<BasisStatus,_std::allocator<BasisStatus>_>::emplace_back<BasisStatus>
                    (&initial_status,&local_5cc8);
        }
        else if (HVar2 != kBasic) {
          if (HVar2 == kLower) {
            std::vector<int,_std::allocator<int>_>::push_back
                      (&initialinactive,(value_type_conflict2 *)&debug_col_status_count);
            local_5cc8 = kActiveAtLower;
            std::vector<BasisStatus,_std::allocator<BasisStatus>_>::emplace_back<BasisStatus>
                      (&initial_status,&local_5cc8);
          }
          else {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&atlower,
                       (value_type_conflict2 *)&debug_col_status_count);
          }
        }
        iVar5 = (int)debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
      }
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_5cc8 = kInactive;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (&debug_col_status_count,5,(value_type_conflict2 *)&local_5cc8);
      for (lVar15 = 0; lVar15 < local_5b10 - (int)local_5b18; lVar15 = lVar15 + 1) {
        HVar2 = local_5b18[lVar15];
        debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[HVar2] =
             debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[HVar2] + 1;
        iVar5 = (int)lVar15;
        switch((ulong)HVar2) {
        case 0:
          if ((-INFINITY <
               (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15]) ||
             ((instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15] < INFINITY)) {
            local_5cc8 = instance->num_con + iVar5;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (&initialinactive,(int *)&local_5cc8);
            local_5cc8 = kActiveAtLower;
            std::vector<BasisStatus,_std::allocator<BasisStatus>_>::emplace_back<BasisStatus>
                      (&initial_status,&local_5cc8);
          }
          else {
            local_5cc8 = instance->num_con + iVar5;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((vector<int,_std::allocator<int>_> *)&atlower,(int *)&local_5cc8);
          }
          break;
        case 1:
          break;
        case 2:
          if ((-INFINITY <
               (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15]) ||
             ((instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15] < INFINITY)) {
            local_5cc8 = instance->num_con + iVar5;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (&initialinactive,(int *)&local_5cc8);
            local_5cc8 = kActiveAtUpper;
            std::vector<BasisStatus,_std::allocator<BasisStatus>_>::emplace_back<BasisStatus>
                      (&initial_status,&local_5cc8);
          }
          else {
            local_5cc8 = instance->num_con + iVar5;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((vector<int,_std::allocator<int>_> *)&atlower,(int *)&local_5cc8);
          }
          break;
        case 3:
          local_5cc8 = instance->num_con + iVar5;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)&atlower,(int *)&local_5cc8);
          break;
        default:
          local_5cc8 = instance->num_con + iVar5;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)&atlower,(int *)&local_5cc8);
        }
      }
      if (instance->num_var ==
          (int)((ulong)((long)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2) +
          (int)((ulong)((long)initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
        std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=
                  (&startinfo.status,&initial_status);
        std::vector<int,_std::allocator<int>_>::operator=(&startinfo.active,&initialinactive);
        std::vector<int,_std::allocator<int>_>::operator=
                  (&startinfo.inactive,(vector<int,_std::allocator<int>_> *)&atlower);
        QpVector::operator=(&startinfo.primal,&res);
        QpVector::operator=(&startinfo.rowact,&x0);
      }
      else {
        qp_model_status = kError;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<BasisStatus,_std::allocator<BasisStatus>_>::~_Vector_base
                (&initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&atlower);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&initialinactive.super__Vector_base<int,_std::allocator<int>_>);
      QpVector::~QpVector(&x0);
      QpVector::~QpVector(&res);
    }
    HighsSolution::~HighsSolution((HighsSolution *)&L);
    highs_solution_00 = (HighsSolution *)0x32241c;
    HighsBasis::~HighsBasis((HighsBasis *)&initialactive);
    if (qp_model_status != kNotset) goto LAB_00322455;
  }
  solveqp_actual(instance,settings,&startinfo,stats,&qp_model_status,&qp_solution,qp_timer);
LAB_00322455:
  QVar7 = quass2highs(instance,settings,(Statistics *)&qp_model_status,(QpModelStatus *)&qp_solution
                      ,(QpSolution *)highs_model_status,(HighsModelStatus *)highs_basis,
                      (HighsBasis *)highs_solution,highs_solution_00);
  QpHotstartInformation::~QpHotstartInformation(&startinfo);
  QpSolution::~QpSolution(&qp_solution);
  return QVar7;
}

Assistant:

QpAsmStatus solveqp(Instance& instance, Settings& settings, Statistics& stats,
                    HighsModelStatus& highs_model_status,
                    HighsBasis& highs_basis, HighsSolution& highs_solution,
                    HighsTimer& qp_timer) {
  QpModelStatus qp_model_status = QpModelStatus::kUndetermined;

  QpSolution qp_solution(instance);

  // presolve

  // scale instance, store scaling factors

  // perturb instance, store perturbance information

  // regularize
  for (HighsInt i = 0; i < instance.num_var; i++) {
    for (HighsInt index = instance.Q.mat.start[i];
         index < instance.Q.mat.start[i + 1]; index++) {
      if (instance.Q.mat.index[index] == i) {
        instance.Q.mat.value[index] += settings.hessianregularizationfactor;
      }
    }
  }

  // compute initial feasible point
  QpHotstartInformation startinfo(instance.num_var, instance.num_con);
  if (instance.num_con == 0 && instance.num_var <= 15000) {
    computeStartingPointBounded(instance, settings, stats, qp_model_status,
                                startinfo, qp_timer);
    if (qp_model_status == QpModelStatus::kOptimal) {
      qp_solution.primal = startinfo.primal;
      return quass2highs(instance, settings, stats, qp_model_status,
                         qp_solution, highs_model_status, highs_basis,
                         highs_solution);
    }
    if (qp_model_status == QpModelStatus::kUnbounded) {
      return quass2highs(instance, settings, stats, qp_model_status,
                         qp_solution, highs_model_status, highs_basis,
                         highs_solution);
    }
  } else {
    computeStartingPointHighs(instance, settings, stats, qp_model_status,
                              startinfo, highs_model_status, highs_basis,
                              highs_solution, qp_timer);
    if (qp_model_status != QpModelStatus::kNotset) {
      return quass2highs(instance, settings, stats, qp_model_status,
                         qp_solution, highs_model_status, highs_basis,
                         highs_solution);
    }
  }

  // solve
  solveqp_actual(instance, settings, startinfo, stats, qp_model_status,
                 qp_solution, qp_timer);

  // undo perturbation and resolve

  // undo scaling and resolve

  // postsolve

  // Transform QP status and qp_solution to HiGHS highs_basis and highs_solution
  return quass2highs(instance, settings, stats, qp_model_status, qp_solution,
                     highs_model_status, highs_basis, highs_solution);
}